

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyfit.h
# Opt level: O0

void __thiscall
PolyFit<double>::PolyFit
          (PolyFit<double> *this,vector<double,_std::allocator<double>_> *x,
          vector<double,_std::allocator<double>_> *y,Options *options)

{
  size_type sVar1;
  size_type sVar2;
  exception *peVar3;
  Options *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  PolyFit<double> *in_RDI;
  double __x;
  double __x_00;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_ffffffffffffffa0;
  
  boost::random::
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
              *)0x246e27);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffffa0);
  in_RDI->x = in_RSI;
  in_RDI->y = in_RDX;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffffa0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffffa0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(in_stack_ffffffffffffffa0);
  in_RDI->options = in_RCX;
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  if (sVar1 != 0) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
    if (sVar1 != 0) {
      sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
      sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
      if (sVar1 == sVar2) {
        if (in_RCX->polyDeg < 1) {
          logging::log(&logger,__x);
          peVar3 = (exception *)__cxa_allocate_exception(8);
          std::exception::exception(peVar3);
          __cxa_throw(peVar3,&std::exception::typeinfo,std::exception::~exception);
        }
        dataToEigen(in_RDI);
        return;
      }
    }
  }
  std::vector<double,_std::allocator<double>_>::size(in_RSI);
  std::vector<double,_std::allocator<double>_>::size(in_RDX);
  logging::log(&logger,__x_00);
  peVar3 = (exception *)__cxa_allocate_exception(8);
  std::exception::exception(peVar3);
  __cxa_throw(peVar3,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

PolyFit(std::vector<T> &x, std::vector<T> &y, Options &options): 
      x(x), y(y), options(options) 
    {
      if (!x.size() || !y.size() || (x.size() != y.size()))
      {
        logger.log(ERROR, "[%s]: Size mismatch (%d,%d)\n",
            __func__, x.size(), y.size());
        throw std::exception();
      }

      if (options.polyDeg < 1)
      {
        logger.log(ERROR, "[%s]: Polynomial degree < 1\n",
            __func__);
        throw std::exception();
      }
      dataToEigen();
    }